

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
wallet::MakeDatabase
          (path *path,DatabaseOptions *options,DatabaseStatus *status,bilingual_str *error)

{
  file_type fVar1;
  byte bVar2;
  bool bVar3;
  __optional_ne_t<wallet::DatabaseFormat,_wallet::DatabaseFormat> _Var4;
  __optional_eq_t<wallet::DatabaseFormat,_wallet::DatabaseFormat> _Var5;
  undefined4 *in_RCX;
  byte *in_RDX;
  path *in_RSI;
  __uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
  in_RDI;
  long in_FS_OFFSET;
  filesystem_error *e;
  bool exists;
  optional<wallet::DatabaseFormat> format;
  bilingual_str *in_stack_fffffffffffffad8;
  bilingual_str *in_stack_fffffffffffffae0;
  bilingual_str *in_stack_fffffffffffffae8;
  bilingual_str *this;
  optional<wallet::DatabaseFormat> *in_stack_fffffffffffffaf0;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  path *in_stack_fffffffffffffb08;
  char *fmt;
  bilingual_str *in_stack_fffffffffffffb10;
  string *original;
  bilingual_str *in_stack_fffffffffffffb18;
  DatabaseOptions *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  byte in_stack_fffffffffffffb2f;
  path *in_stack_fffffffffffffb30;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  path *in_stack_fffffffffffffb68;
  bilingual_str local_3f8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [4];
  char local_278 [128];
  string local_1f8 [8];
  undefined1 local_f8 [240];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::symlink_status(in_RSI);
  fVar1 = std::filesystem::file_status::type((file_status *)in_stack_fffffffffffffad8);
  std::optional<wallet::DatabaseFormat>::optional
            ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8);
  if (fVar1 == not_found) {
    if ((*in_RDX & 1) != 0) {
      original = local_1f8;
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffae0);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      Untranslated(original);
      bilingual_str::operator=(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
      bilingual_str::~bilingual_str(in_stack_fffffffffffffad8);
      std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
      std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
      *in_RCX = 5;
      std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>::
      unique_ptr<std::default_delete<wallet::WalletDatabase>,void>
                ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *
                 )in_stack_fffffffffffffad8,(nullptr_t)0x177a6a6);
      goto LAB_0177adb8;
    }
  }
  else {
    in_stack_fffffffffffffb30 = (path *)(local_f8 + 0x28);
    BDBDataFile(in_stack_fffffffffffffb08);
    bVar2 = IsBDBFile((path *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
    fs::path::~path((path *)in_stack_fffffffffffffad8);
    if ((bVar2 & 1) != 0) {
      std::optional<wallet::DatabaseFormat>::optional<wallet::DatabaseFormat,_true>
                ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffae8,
                 (DatabaseFormat *)in_stack_fffffffffffffae0);
    }
    in_stack_fffffffffffffb20 = (DatabaseOptions *)local_f8;
    SQLiteDataFile(in_stack_fffffffffffffb08);
    in_stack_fffffffffffffb2f = IsSQLiteFile(in_stack_fffffffffffffb68);
    fs::path::~path((path *)in_stack_fffffffffffffad8);
    if ((in_stack_fffffffffffffb2f & 1) != 0) {
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8);
      if (bVar3) {
        fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffae0);
        tinyformat::format<std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
        Untranslated(&in_stack_fffffffffffffb10->original);
        bilingual_str::operator=(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
        bilingual_str::~bilingual_str(in_stack_fffffffffffffad8);
        std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
        std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
        *in_RCX = 2;
        std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>::
        unique_ptr<std::default_delete<wallet::WalletDatabase>,void>
                  ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                    *)in_stack_fffffffffffffad8,(nullptr_t)0x177a53c);
        goto LAB_0177adb8;
      }
      std::optional<wallet::DatabaseFormat>::optional<wallet::DatabaseFormat,_true>
                ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffae8,
                 (DatabaseFormat *)in_stack_fffffffffffffae0);
    }
  }
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8);
  if ((bVar3) || ((*in_RDX & 1) == 0)) {
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8);
    if ((bVar3) && ((in_RDX[1] & 1) != 0)) {
      args = local_2f8;
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffae0);
      tinyformat::format<std::__cxx11::string>((char *)in_stack_fffffffffffffb08,args);
      Untranslated(&in_stack_fffffffffffffb10->original);
      bilingual_str::operator=(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
      bilingual_str::~bilingual_str(in_stack_fffffffffffffad8);
      std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
      std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
      *in_RCX = 4;
      std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>::
      unique_ptr<std::default_delete<wallet::WalletDatabase>,void>
                ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *
                 )in_stack_fffffffffffffad8,(nullptr_t)0x177a8ea);
    }
    else {
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8);
      uVar6 = false;
      if (bVar3) {
        bVar3 = std::optional::operator_cast_to_bool
                          ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8);
        uVar6 = false;
        if (bVar3) {
          _Var5 = std::operator==((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffae8,
                                  (DatabaseFormat *)in_stack_fffffffffffffae0);
          uVar6 = false;
          if (_Var5) {
            uVar6 = std::operator==((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffae8,
                                    (DatabaseFormat *)in_stack_fffffffffffffae0);
          }
        }
      }
      if ((__optional_eq_t<wallet::DatabaseFormat,_wallet::DatabaseFormat>)uVar6 != false) {
        std::optional<wallet::DatabaseFormat>::optional<wallet::DatabaseFormat,_true>
                  ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffae8,
                   (DatabaseFormat *)in_stack_fffffffffffffae0);
      }
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8);
      if (((bVar3) &&
          (bVar3 = std::optional::operator_cast_to_bool
                             ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8), bVar3)
          ) && (_Var4 = std::operator!=((optional<wallet::DatabaseFormat> *)
                                        CONCAT17(uVar6,in_stack_fffffffffffffaf8),
                                        in_stack_fffffffffffffaf0), _Var4)) {
        fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffae0);
        tinyformat::format<std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
        Untranslated(&in_stack_fffffffffffffb10->original);
        bilingual_str::operator=(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
        bilingual_str::~bilingual_str(in_stack_fffffffffffffad8);
        std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
        std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
        *in_RCX = 2;
        std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>::
        unique_ptr<std::default_delete<wallet::WalletDatabase>,void>
                  ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                    *)in_stack_fffffffffffffad8,(nullptr_t)0x177ab03);
      }
      else {
        bVar3 = std::optional::operator_cast_to_bool
                          ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8);
        if (!bVar3) {
          std::optional::operator_cast_to_bool
                    ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8);
        }
        bVar3 = std::optional::operator_cast_to_bool
                          ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffad8);
        if (!bVar3) {
          std::optional<wallet::DatabaseFormat>::optional<wallet::DatabaseFormat,_true>
                    ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffae8,
                     (DatabaseFormat *)in_stack_fffffffffffffae0);
        }
        _Var5 = std::operator==((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffae8,
                                (DatabaseFormat *)in_stack_fffffffffffffae0);
        if (_Var5) {
          MakeSQLiteDatabase(in_stack_fffffffffffffb30,
                             (DatabaseOptions *)
                             CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                             (DatabaseStatus *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
          std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>::
          unique_ptr<wallet::SQLiteDatabase,std::default_delete<wallet::SQLiteDatabase>,void>
                    ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                      *)in_stack_fffffffffffffae8,
                     (unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_>
                      *)in_stack_fffffffffffffae0);
          std::unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_>::
          ~unique_ptr((unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_>
                       *)in_stack_fffffffffffffae8);
        }
        else {
          _Var5 = std::operator==((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffae8,
                                  (DatabaseFormat *)in_stack_fffffffffffffae0);
          if (_Var5) {
            MakeBerkeleyRODatabase
                      ((path *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                       in_stack_fffffffffffffb20,(DatabaseStatus *)in_stack_fffffffffffffb18,
                       in_stack_fffffffffffffb10);
            std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>::
            unique_ptr<wallet::BerkeleyRODatabase,std::default_delete<wallet::BerkeleyRODatabase>,void>
                      ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                        *)in_stack_fffffffffffffae8,
                       (unique_ptr<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>_>
                        *)in_stack_fffffffffffffae0);
            std::
            unique_ptr<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>_>
            ::~unique_ptr((unique_ptr<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>_>
                           *)in_stack_fffffffffffffae8);
          }
          else {
            this = local_3f8;
            fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffae0);
            tinyformat::format<std::__cxx11::string>
                      ((char *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
            Untranslated(&in_stack_fffffffffffffb10->original);
            bilingual_str::operator=(this,in_stack_fffffffffffffae0);
            bilingual_str::~bilingual_str(in_stack_fffffffffffffad8);
            std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
            std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
            *in_RCX = 2;
            std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>::
            unique_ptr<std::default_delete<wallet::WalletDatabase>,void>
                      ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                        *)in_stack_fffffffffffffad8,(nullptr_t)0x177ad68);
          }
        }
      }
    }
  }
  else {
    fmt = local_278;
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffae0);
    tinyformat::format<std::__cxx11::string>(fmt,in_stack_fffffffffffffb00);
    Untranslated(&in_stack_fffffffffffffb10->original);
    bilingual_str::operator=(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffad8);
    std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
    std::__cxx11::string::~string(&in_stack_fffffffffffffad8->original);
    *in_RCX = 2;
    std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>::
    unique_ptr<std::default_delete<wallet::WalletDatabase>,void>
              ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
               in_stack_fffffffffffffad8,(nullptr_t)0x177a7c8);
  }
LAB_0177adb8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
          )(tuple<wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>)
           in_RDI.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<WalletDatabase> MakeDatabase(const fs::path& path, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error)
{
    bool exists;
    try {
        exists = fs::symlink_status(path).type() != fs::file_type::not_found;
    } catch (const fs::filesystem_error& e) {
        error = Untranslated(strprintf("Failed to access database path '%s': %s", fs::PathToString(path), fsbridge::get_filesystem_error_message(e)));
        status = DatabaseStatus::FAILED_BAD_PATH;
        return nullptr;
    }

    std::optional<DatabaseFormat> format;
    if (exists) {
        if (IsBDBFile(BDBDataFile(path))) {
            format = DatabaseFormat::BERKELEY;
        }
        if (IsSQLiteFile(SQLiteDataFile(path))) {
            if (format) {
                error = Untranslated(strprintf("Failed to load database path '%s'. Data is in ambiguous format.", fs::PathToString(path)));
                status = DatabaseStatus::FAILED_BAD_FORMAT;
                return nullptr;
            }
            format = DatabaseFormat::SQLITE;
        }
    } else if (options.require_existing) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Path does not exist.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_NOT_FOUND;
        return nullptr;
    }

    if (!format && options.require_existing) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Data is not in recognized format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }

    if (format && options.require_create) {
        error = Untranslated(strprintf("Failed to create database path '%s'. Database already exists.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_ALREADY_EXISTS;
        return nullptr;
    }

    // If BERKELEY was the format, then change the format from BERKELEY to BERKELEY_RO
    if (format && options.require_format && format == DatabaseFormat::BERKELEY && options.require_format == DatabaseFormat::BERKELEY_RO) {
        format = DatabaseFormat::BERKELEY_RO;
    }

    // A db already exists so format is set, but options also specifies the format, so make sure they agree
    if (format && options.require_format && format != options.require_format) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Data is not in required format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }

    // Format is not set when a db doesn't already exist, so use the format specified by the options if it is set.
    if (!format && options.require_format) format = options.require_format;

    // If the format is not specified or detected, choose the default format based on what is available. We prefer BDB over SQLite for now.
    if (!format) {
#ifdef USE_SQLITE
        format = DatabaseFormat::SQLITE;
#endif
#ifdef USE_BDB
        format = DatabaseFormat::BERKELEY;
#endif
    }

    if (format == DatabaseFormat::SQLITE) {
#ifdef USE_SQLITE
        if constexpr (true) {
            return MakeSQLiteDatabase(path, options, status, error);
        } else
#endif
        {
            error = Untranslated(strprintf("Failed to open database path '%s'. Build does not support SQLite database format.", fs::PathToString(path)));
            status = DatabaseStatus::FAILED_BAD_FORMAT;
            return nullptr;
        }
    }

    if (format == DatabaseFormat::BERKELEY_RO) {
        return MakeBerkeleyRODatabase(path, options, status, error);
    }

#ifdef USE_BDB
    if constexpr (true) {
        return MakeBerkeleyDatabase(path, options, status, error);
    } else
#endif
    {
        error = Untranslated(strprintf("Failed to open database path '%s'. Build does not support Berkeley DB database format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }
}